

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_version(uchar **p,uchar *end,int *ver)

{
  int iVar1;
  size_t local_38;
  size_t len;
  int *piStack_28;
  int ret;
  int *ver_local;
  uchar *end_local;
  uchar **p_local;
  
  piStack_28 = ver;
  ver_local = (int *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,0xa0);
  if (len._4_4_ == 0) {
    ver_local = (int *)(*(long *)end_local + local_38);
    iVar1 = mbedtls_asn1_get_int((uchar **)end_local,(uchar *)ver_local,piStack_28);
    if (iVar1 == 0) {
      if (*(int **)end_local == ver_local) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = -0x2266;
      }
    }
    else {
      p_local._4_4_ = iVar1 + -0x2200;
    }
  }
  else {
    p_local._4_4_ = len._4_4_;
    if (len._4_4_ == -0x62) {
      *piStack_28 = 0;
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_version( unsigned char **p,
                             const unsigned char *end,
                             int *ver )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            *ver = 0;
            return( 0 );
        }

        return( ret );
    }

    end = *p + len;

    if( ( ret = mbedtls_asn1_get_int( p, end, ver ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_VERSION + ret );

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_VERSION +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}